

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

MethodList * __thiscall
capnp::InterfaceSchema::getMethods(MethodList *__return_storage_ptr__,InterfaceSchema *this)

{
  Reader list;
  Reader local_a8;
  Reader local_78;
  Reader local_48;
  InterfaceSchema local_18;
  InterfaceSchema *local_10;
  InterfaceSchema *this_local;
  
  local_18 = (InterfaceSchema)(this->super_Schema).raw;
  local_10 = this;
  Schema::getProto(&local_a8,&this->super_Schema);
  capnp::schema::Node::Reader::getInterface(&local_78,&local_a8);
  capnp::schema::Node::Interface::Reader::getMethods(&local_48,&local_78);
  list.reader.capTable = local_48.reader.capTable;
  list.reader.segment = local_48.reader.segment;
  list.reader.ptr = local_48.reader.ptr;
  list.reader.elementCount = local_48.reader.elementCount;
  list.reader.step = local_48.reader.step;
  list.reader.structDataSize = local_48.reader.structDataSize;
  list.reader.structPointerCount = local_48.reader.structPointerCount;
  list.reader.elementSize = local_48.reader.elementSize;
  list.reader._39_1_ = local_48.reader._39_1_;
  list.reader.nestingLimit = local_48.reader.nestingLimit;
  list.reader._44_4_ = local_48.reader._44_4_;
  MethodList::MethodList(__return_storage_ptr__,local_18,list);
  return __return_storage_ptr__;
}

Assistant:

InterfaceSchema::MethodList InterfaceSchema::getMethods() const {
  return MethodList(*this, getProto().getInterface().getMethods());
}